

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::updatePose(btSoftBody *this)

{
  btMatrix3x3 *this_00;
  uint uVar1;
  float *pfVar2;
  btVector3 *v;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  btScalar bVar7;
  float fVar8;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float fVar9;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  btVector3 bVar10;
  btMatrix3x3 local_198;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  btVector3 com;
  btMatrix3x3 r;
  btMatrix3x3 r_1;
  btMatrix3x3 local_c0;
  btMatrix3x3 local_90;
  btMatrix3x3 s;
  
  if ((this->m_pose).m_bframe == true) {
    com = evaluateCom(this);
    *(undefined8 *)(this->m_pose).m_com.m_floats = com.m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_com.m_floats + 2) = com.m_floats._8_8_;
    fVar8 = 0.0;
    fVar9 = 0.0;
    local_198.m_el[1].m_floats[2] = 0.0;
    local_198.m_el[1].m_floats[3] = 0.0;
    local_198.m_el[2].m_floats[0] = 0.0;
    local_198.m_el[2].m_floats[1] = 0.0;
    local_198.m_el[0].m_floats[1] = 0.0;
    local_198.m_el[0].m_floats[2] = 0.0;
    local_198.m_el[0].m_floats[3] = 0.0;
    local_198.m_el[1].m_floats[0] = 0.0;
    local_198.m_el[0].m_floats[0] = 1.1920929e-07;
    local_198.m_el[1].m_floats[1] = 2.3841858e-07;
    local_198.m_el[2].m_floats[2] = 3.5762787e-07;
    local_198.m_el[2].m_floats[3] = 0.0;
    uVar1 = (this->m_nodes).m_size;
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    local_148 = 0x34000000;
    uStack_140 = 0;
    local_168 = 0x34800000;
    uStack_160 = 0;
    lVar3 = 0x10;
    for (uVar4 = 0; bVar7 = local_198.m_el[2].m_floats[2], uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pfVar2 = (this->m_pose).m_wgh.m_data;
      local_158 = local_198.m_el[2].m_floats[0];
      fStack_154 = local_198.m_el[2].m_floats[1];
      fStack_150 = fVar8;
      fStack_14c = fVar9;
      bVar10 = operator-((btVector3 *)
                         ((long)&(((Node *)(&((this->m_nodes).m_data)->m_x + -1))->super_Feature).
                                 super_Element.m_tag + lVar3),&com);
      fVar8 = pfVar2[uVar4];
      r.m_el[0].m_floats[1] = fVar8 * bVar10.m_floats[1];
      r.m_el[0].m_floats[0] = fVar8 * bVar10.m_floats[0];
      r.m_el[0].m_floats[2] = bVar10.m_floats[2] * fVar8;
      r.m_el[0].m_floats[3] = 0.0;
      v = (btVector3 *)((long)((this->m_pose).m_pos.m_data)->m_floats + uVar6);
      bVar10 = operator*(v,(btScalar *)&r);
      local_198.m_el[0].m_floats[0] = (float)local_148 + bVar10.m_floats[0];
      local_198.m_el[0].m_floats[1] = local_198.m_el[0].m_floats[1] + bVar10.m_floats[1];
      fVar8 = local_148._4_4_ + extraout_XMM0_Dc;
      local_148 = CONCAT44(local_198.m_el[0].m_floats[1],local_198.m_el[0].m_floats[0]);
      uStack_140 = CONCAT44(extraout_XMM0_Dd + 0.0,fVar8);
      local_198.m_el[0].m_floats[2] = bVar10.m_floats[2] + local_198.m_el[0].m_floats[2];
      bVar10 = operator*(v,r.m_el[0].m_floats + 1);
      local_198.m_el[1].m_floats[0] = local_198.m_el[1].m_floats[0] + bVar10.m_floats[0];
      local_198.m_el[1].m_floats[1] = (float)local_168 + bVar10.m_floats[1];
      uStack_160 = CONCAT44(local_198.m_el[1].m_floats[3] + extraout_XMM0_Dd_00,
                            local_198.m_el[1].m_floats[2] + extraout_XMM0_Dc_00);
      local_198.m_el[1].m_floats[2] = bVar10.m_floats[2] + local_198.m_el[1].m_floats[2];
      local_168._0_4_ = local_198.m_el[1].m_floats[0];
      local_168._4_4_ = local_198.m_el[1].m_floats[1];
      bVar10 = operator*(v,r.m_el[0].m_floats + 2);
      local_198.m_el[2].m_floats[0] = local_158 + bVar10.m_floats[0];
      local_198.m_el[2].m_floats[1] = fStack_154 + bVar10.m_floats[1];
      fVar8 = fStack_150 + extraout_XMM0_Dc_01;
      fVar9 = fStack_14c + extraout_XMM0_Dd_01;
      local_198.m_el[2].m_floats[2] = bVar7 + bVar10.m_floats[2];
      local_168 = CONCAT44(local_168._4_4_,local_168._4_4_);
      uStack_160 = CONCAT44(local_168._4_4_,local_168._4_4_);
      uVar6 = uVar6 + 0x10;
      lVar3 = lVar3 + 0x78;
      local_158 = local_198.m_el[2].m_floats[0];
      fStack_154 = local_198.m_el[2].m_floats[1];
      fStack_150 = fVar8;
      fStack_14c = fVar9;
    }
    PolarDecompose(&local_198,&r,&s);
    *(undefined8 *)(this->m_pose).m_rot.m_el[0].m_floats = r.m_el[0].m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_rot.m_el[0].m_floats + 2) = r.m_el[0].m_floats._8_8_;
    *(undefined8 *)(this->m_pose).m_rot.m_el[1].m_floats = r.m_el[1].m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_rot.m_el[1].m_floats + 2) = r.m_el[1].m_floats._8_8_;
    *(undefined8 *)(this->m_pose).m_rot.m_el[2].m_floats = r.m_el[2].m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_rot.m_el[2].m_floats + 2) = r.m_el[2].m_floats._8_8_;
    btMatrix3x3::transpose(&local_90,&r);
    operator*(&local_c0,&(this->m_pose).m_aqq,&local_90);
    operator*(&r_1,&local_c0,&local_198);
    *(undefined8 *)(this->m_pose).m_scl.m_el[0].m_floats = r_1.m_el[0].m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 2) = r_1.m_el[0].m_floats._8_8_;
    *(undefined8 *)(this->m_pose).m_scl.m_el[1].m_floats = r_1.m_el[1].m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_scl.m_el[1].m_floats + 2) = r_1.m_el[1].m_floats._8_8_;
    *(undefined8 *)(this->m_pose).m_scl.m_el[2].m_floats = r_1.m_el[2].m_floats._0_8_;
    *(undefined8 *)((this->m_pose).m_scl.m_el[2].m_floats + 2) = r_1.m_el[2].m_floats._8_8_;
    if (1.0 < (this->m_cfg).maxvolume) {
      this_00 = &(this->m_pose).m_scl;
      bVar7 = btMatrix3x3::determinant(this_00);
      fVar8 = 1.0 / bVar7;
      local_c0.m_el[0].m_floats[0] = 1.0;
      if ((1.0 <= fVar8) &&
         (local_c0.m_el[0].m_floats[0] = (this->m_cfg).maxvolume,
         fVar8 <= local_c0.m_el[0].m_floats[0])) {
        local_c0.m_el[0].m_floats[0] = fVar8;
      }
      for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 0x10) {
        bVar10 = operator*((btVector3 *)((long)this_00->m_el[0].m_floats + lVar3),
                           (btScalar *)&local_c0);
        *(btScalar (*) [4])((long)r_1.m_el[0].m_floats + lVar3) = bVar10.m_floats;
      }
      *(undefined8 *)this_00->m_el[0].m_floats = r_1.m_el[0].m_floats._0_8_;
      *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 2) = r_1.m_el[0].m_floats._8_8_;
      *(undefined8 *)(this->m_pose).m_scl.m_el[1].m_floats = r_1.m_el[1].m_floats._0_8_;
      *(undefined8 *)((this->m_pose).m_scl.m_el[1].m_floats + 2) = r_1.m_el[1].m_floats._8_8_;
      *(undefined8 *)(this->m_pose).m_scl.m_el[2].m_floats = r_1.m_el[2].m_floats._0_8_;
      *(undefined8 *)((this->m_pose).m_scl.m_el[2].m_floats + 2) = r_1.m_el[2].m_floats._8_8_;
    }
  }
  return;
}

Assistant:

void					btSoftBody::updatePose()
{
	if(m_pose.m_bframe)
	{
		btSoftBody::Pose&	pose=m_pose;
		const btVector3		com=evaluateCom();
		/* Com			*/ 
		pose.m_com	=	com;
		/* Rotation		*/ 
		btMatrix3x3		Apq;
		const btScalar	eps=SIMD_EPSILON;
		Apq[0]=Apq[1]=Apq[2]=btVector3(0,0,0);
		Apq[0].setX(eps);Apq[1].setY(eps*2);Apq[2].setZ(eps*3);
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			const btVector3		a=pose.m_wgh[i]*(m_nodes[i].m_x-com);
			const btVector3&	b=pose.m_pos[i];
			Apq[0]+=a.x()*b;
			Apq[1]+=a.y()*b;
			Apq[2]+=a.z()*b;
		}
		btMatrix3x3		r,s;
		PolarDecompose(Apq,r,s);
		pose.m_rot=r;
		pose.m_scl=pose.m_aqq*r.transpose()*Apq;
		if(m_cfg.maxvolume>1)
		{
			const btScalar	idet=Clamp<btScalar>(	1/pose.m_scl.determinant(),
				1,m_cfg.maxvolume);
			pose.m_scl=Mul(pose.m_scl,idet);
		}

	}
}